

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O0

ans_fold_decode<5U> * ans_fold_decode<5U>::load(uint8_t *in_u8)

{
  uint uVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var6
  ;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  uint64_t uVar10;
  ans_fold_decode<5U> *in_RDI;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [64];
  uint32_t except_bytes;
  uint32_t k;
  value_type cur_freq;
  size_t sym;
  uint32_t cur_base;
  uint64_t tmp;
  size_type max_sym;
  uint max_norm_freq;
  ans_fold_decode<5U> *model;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined2 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3a;
  undefined4 in_stack_ffffffffffffff3c;
  undefined2 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff42;
  undefined4 in_stack_ffffffffffffff44;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first_00;
  uint local_90;
  uint16_t local_8c;
  ulong local_88;
  int local_7c;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffb8;
  uint local_30 [7];
  undefined1 local_11;
  undefined1 extraout_var [56];
  
  auVar11 = in_ZMM0._0_16_;
  local_11 = 0;
  ans_fold_decode((ans_fold_decode<5U> *)
                  CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  ans_load_interp((uint8_t *)in_stack_ffffffffffffffb8._M_current);
  __first_00._M_current = local_30;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,
                      CONCAT22(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40)),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,
                      CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,
                      CONCAT22(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40)));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff28._M_current);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff28._M_current);
  _Var6._M_current._2_2_ = in_stack_ffffffffffffff42;
  _Var6._M_current._0_2_ = in_stack_ffffffffffffff40;
  _Var6._M_current._4_4_ = in_stack_ffffffffffffff44;
  _Var6 = std::
          max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (__first_00,_Var6);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
  operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             *)&stack0xffffffffffffffb8);
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff28._M_current);
  std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff28._M_current);
  __first._M_current._4_4_ = in_stack_ffffffffffffff34;
  __first._M_current._0_4_ = in_stack_ffffffffffffff30;
  iVar3 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (__first,in_stack_ffffffffffffff28,0);
  in_RDI->frame_size = (long)iVar3;
  in_RDI->frame_mask = in_RDI->frame_size - 1;
  auVar11 = vcvtusi2sd_avx512f(auVar11,in_RDI->frame_size);
  auVar12._0_8_ = log2(auVar11._0_8_);
  auVar12._8_56_ = extraout_var;
  uVar10 = vcvttsd2usi_avx512f(auVar12._0_16_);
  in_RDI->frame_log2 = uVar10;
  std::vector<dec_entry_fold,_std::allocator<dec_entry_fold>_>::resize
            ((vector<dec_entry_fold,_std::allocator<dec_entry_fold>_> *)_Var6._M_current,
             (size_type)__first_00._M_current);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->nfreqs);
  local_7c = 0;
  for (local_88 = 0; local_88 <= sVar7 - 1; local_88 = local_88 + 1) {
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->nfreqs,local_88);
    uVar1 = *pvVar8;
    for (local_90 = 0; local_90 < uVar1; local_90 = local_90 + 1) {
      local_8c = (uint16_t)uVar1;
      pvVar9 = std::vector<dec_entry_fold,_std::allocator<dec_entry_fold>_>::operator[]
                         (&in_RDI->table,(ulong)(local_7c + local_90));
      pvVar9->freq = local_8c;
      uVar4 = ans_fold_exception_bytes<5u>((uint32_t)local_88);
      uVar5 = ans_fold_undo_mapping<5u>((uint32_t)local_88);
      uVar5 = uVar5 + uVar4 * 0x40000000;
      pvVar9 = std::vector<dec_entry_fold,_std::allocator<dec_entry_fold>_>::operator[]
                         (&in_RDI->table,(ulong)(local_7c + local_90));
      pvVar9->mapped_num = uVar5;
      uVar2 = (uint16_t)local_90;
      pvVar9 = std::vector<dec_entry_fold,_std::allocator<dec_entry_fold>_>::operator[]
                         (&in_RDI->table,(ulong)(local_7c + local_90));
      pvVar9->offset = uVar2;
    }
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->nfreqs,local_88);
    local_7c = *pvVar8 + local_7c;
  }
  in_RDI->lower_bound = in_RDI->frame_size << 4;
  return in_RDI;
}

Assistant:

static ans_fold_decode load(const uint8_t* in_u8)
    {
        ans_fold_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        auto max_norm_freq
            = *std::max_element(model.nfreqs.begin(), model.nfreqs.end());
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint32_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                uint32_t except_bytes = ans_fold_exception_bytes<fidelity>(sym);
                model.table[cur_base + k].mapped_num
                    = ans_fold_undo_mapping<fidelity>(sym)
                    + (except_bytes << 30);
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }